

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sad_impl_avx2.c
# Opt level: O0

uint aom_sad64x128_avg_avx2
               (uint8_t *src_ptr,int src_stride,uint8_t *ref_ptr,int ref_stride,uint8_t *second_pred
               )

{
  uint uVar1;
  uint uVar2;
  uint32_t sum;
  uint8_t *in_stack_000000b8;
  int in_stack_000000c0;
  int in_stack_000000c4;
  uint8_t *in_stack_000000c8;
  int in_stack_000000d4;
  uint8_t *in_stack_000000d8;
  int in_stack_ffffffffffffffd0;
  
  uVar1 = sad_w64_avg_avx2(in_stack_000000d8,in_stack_000000d4,in_stack_000000c8,in_stack_000000c4,
                           in_stack_000000c0,in_stack_000000b8,in_stack_ffffffffffffffd0);
  uVar2 = sad_w64_avg_avx2(in_stack_000000d8,in_stack_000000d4,in_stack_000000c8,in_stack_000000c4,
                           in_stack_000000c0,in_stack_000000b8,in_stack_ffffffffffffffd0);
  return uVar2 + uVar1;
}

Assistant:

unsigned int aom_sad64x128_avg_avx2(const uint8_t *src_ptr, int src_stride,
                                    const uint8_t *ref_ptr, int ref_stride,
                                    const uint8_t *second_pred) {
  uint32_t sum = sad_w64_avg_avx2(src_ptr, src_stride, ref_ptr, ref_stride, 64,
                                  second_pred, 64);
  src_ptr += src_stride << 6;
  ref_ptr += ref_stride << 6;
  second_pred += 64 << 6;
  sum += sad_w64_avg_avx2(src_ptr, src_stride, ref_ptr, ref_stride, 64,
                          second_pred, 64);
  return sum;
}